

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

u_int slength(slist *s)

{
  u_int local_14;
  slist *psStack_10;
  u_int n;
  slist *s_local;
  
  local_14 = 0;
  for (psStack_10 = s; psStack_10 != (slist *)0x0; psStack_10 = psStack_10->next) {
    if ((psStack_10->s).code != -1) {
      local_14 = local_14 + 1;
    }
  }
  return local_14;
}

Assistant:

static u_int
slength(struct slist *s)
{
	u_int n = 0;

	for (; s; s = s->next)
		if (s->s.code != NOP)
			++n;
	return n;
}